

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O0

bool __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<5>::
DecodeInternal<draco::PointAttributeVectorOutputIterator<unsigned_int>>
          (DynamicIntegerPointsKdTreeDecoder<5> *this,uint32_t num_points,
          PointAttributeVectorOutputIterator<unsigned_int> *oit)

{
  uint32_t uVar1;
  undefined1 uVar2;
  bool bVar3;
  uint uVar4;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  PointAttributeVectorOutputIterator<unsigned_int> *in_RDX;
  uint32_t in_ESI;
  DynamicIntegerPointsKdTreeDecoder<5> *in_RDI;
  uint32_t second_half;
  uint32_t first_half;
  uint32_t number;
  int incoming_bits;
  uint32_t modifier;
  int num_remaining_bits;
  uint32_t num_remaining_bits_1;
  uint32_t j;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  uint32_t level;
  uint32_t axis;
  VectorUint32 *levels;
  VectorUint32 *old_base;
  uint32_t stack_pos;
  uint32_t last_axis;
  uint32_t num_remaining_points;
  DecodingStatus status;
  stack<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>_>
  status_stack;
  DecodingStatus init_status;
  value_type *in_stack_fffffffffffffdb8;
  int nbits;
  DynamicIntegerPointsKdTreeDecoder<5> *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  int iVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdd0;
  DirectBitDecoder *in_stack_fffffffffffffdd8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffde0;
  VectorUint32 *in_stack_fffffffffffffde8;
  value_type in_stack_fffffffffffffdf4;
  DirectBitDecoder *in_stack_fffffffffffffdf8;
  VectorUint32 *in_stack_fffffffffffffe20;
  PointAttributeVectorOutputIterator<unsigned_int> *in_stack_fffffffffffffe28;
  value_type local_1c8;
  undefined7 in_stack_fffffffffffffe58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  DecodingStatus local_150;
  DecodingStatus local_144;
  uint32_t local_138;
  uint32_t local_134;
  uint local_130;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_110;
  value_type local_10c;
  uint32_t local_108;
  undefined4 local_104;
  PointAttributeVectorOutputIterator<unsigned_int> *local_100;
  reference local_f8;
  uint local_ec;
  uint32_t local_e8;
  uint local_e4;
  undefined8 local_e0;
  uint local_d8;
  DecodingStatus local_7c;
  undefined4 local_6c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  undefined4 local_3c;
  PointAttributeVectorOutputIterator<unsigned_int> *local_20;
  uint32_t local_14;
  byte local_1;
  
  local_3c = 0;
  local_20 = in_RDX;
  local_14 = in_ESI;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1d5869);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8,
             (value_type_conflict5 *)in_stack_fffffffffffffdd0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator[](&in_RDI->base_stack_,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (in_stack_fffffffffffffdd0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffdd0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1d58da);
  local_6c = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1d590d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8,
             (value_type_conflict5 *)in_stack_fffffffffffffdd0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator[](&in_RDI->levels_stack_,0);
  this_00 = &local_68;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (in_stack_fffffffffffffdd0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffdd0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1d5985);
  DecodingStatus::DecodingStatus(&local_7c,local_14,0,0);
  std::
  stack<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,std::deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>>>
  ::
  stack<std::deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>>,void>
            ((stack<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>_>
              *)in_stack_fffffffffffffdc0);
  std::
  stack<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>_>
  ::push((stack<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>_>
          *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  do {
    uVar2 = std::
            stack<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>_>
            ::empty((stack<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>_>
                     *)0x1d59e5);
    if (((uVar2 ^ 0xff) & 1) == 0) {
      local_1 = 1;
LAB_001d62f7:
      local_104 = 1;
      std::
      stack<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>_>
      ::~stack((stack<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>_>
                *)0x1d6304);
      return (bool)(local_1 & 1);
    }
    pvVar5 = std::
             stack<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>_>
             ::top((stack<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>_>
                    *)0x1d5a0d);
    local_d8 = pvVar5->stack_pos;
    local_e0._0_4_ = pvVar5->num_remaining_points;
    local_e0._4_4_ = pvVar5->last_axis;
    std::
    stack<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>_>
    ::pop((stack<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>_>
           *)0x1d5a41);
    local_e4 = (uint)local_e0;
    local_e8 = local_e0._4_4_;
    local_ec = local_d8;
    local_f8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&in_RDI->base_stack_,(ulong)local_d8);
    local_100 = (PointAttributeVectorOutputIterator<unsigned_int> *)
                std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[](&in_RDI->levels_stack_,(ulong)local_ec);
    if (local_14 < local_e4) {
      local_1 = 0;
      goto LAB_001d62f7;
    }
    local_108 = GetAxis(in_RDI,local_e4,(VectorUint32 *)local_100,local_e8);
    if (in_RDI->dimension_ <= local_108) {
      local_1 = 0;
      goto LAB_001d62f7;
    }
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,
                        (ulong)local_108);
    uVar1 = local_108;
    nbits = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
    local_10c = *pvVar6;
    if (in_RDI->bit_length_ == local_10c) {
      for (local_110 = 0; local_110 < local_e4; local_110 = local_110 + 1) {
        PointAttributeVectorOutputIterator<unsigned_int>::operator*(local_20);
        PointAttributeVectorOutputIterator<unsigned_int>::operator=
                  (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
        PointAttributeVectorOutputIterator<unsigned_int>::operator++
                  ((PointAttributeVectorOutputIterator<unsigned_int> *)in_stack_fffffffffffffdc0);
        in_RDI->num_decoded_points_ = in_RDI->num_decoded_points_ + 1;
      }
    }
    else if (local_e4 < 3) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&in_RDI->axes_,0);
      *pvVar7 = uVar1;
      for (local_114 = 1; local_114 < in_RDI->dimension_; local_114 = local_114 + 1) {
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&in_RDI->axes_,(ulong)(local_114 - 1));
        if (*pvVar7 == in_RDI->dimension_ - 1) {
          local_1c8 = 0;
        }
        else {
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&in_RDI->axes_,(ulong)(local_114 - 1));
          local_1c8 = *pvVar7 + 1;
        }
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&in_RDI->axes_,(ulong)local_114);
        *pvVar7 = local_1c8;
      }
      for (local_118 = 0; local_118 < local_e4; local_118 = local_118 + 1) {
        for (local_11c = 0; local_11c < in_RDI->dimension_; local_11c = local_11c + 1) {
          in_stack_fffffffffffffe20 = &in_RDI->p_;
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&in_RDI->axes_,(ulong)local_11c);
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (in_stack_fffffffffffffe20,(ulong)*pvVar7);
          *pvVar7 = 0;
          uVar1 = in_RDI->bit_length_;
          in_stack_fffffffffffffe28 = local_100;
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&in_RDI->axes_,(ulong)local_11c);
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              in_stack_fffffffffffffe28,(ulong)*pvVar7);
          local_120 = uVar1 - *pvVar6;
          if (local_120 != 0) {
            pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (&in_RDI->axes_,(ulong)local_11c);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      (&in_RDI->p_,(ulong)*pvVar7);
            bVar3 = DirectBitDecoder::DecodeLeastSignificantBits32
                              (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
                               (uint32_t *)in_stack_fffffffffffffde8);
            if (!bVar3) {
              local_1 = 0;
              goto LAB_001d62f7;
            }
          }
          pvVar8 = local_f8;
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&in_RDI->axes_,(ulong)local_11c);
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (pvVar8,(ulong)*pvVar7);
          in_stack_fffffffffffffdf4 = *pvVar6;
          in_stack_fffffffffffffde8 = &in_RDI->p_;
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&in_RDI->axes_,(ulong)local_11c);
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (in_stack_fffffffffffffde8,(ulong)*pvVar7);
          uVar4 = in_stack_fffffffffffffdf4 | *pvVar7;
          in_stack_fffffffffffffdf8 = (DirectBitDecoder *)&in_RDI->p_;
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&in_RDI->axes_,(ulong)local_11c);
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&in_stack_fffffffffffffdf8->bits_,(ulong)*pvVar7);
          *pvVar7 = uVar4;
        }
        in_stack_fffffffffffffdd8 = (DirectBitDecoder *)&in_RDI->p_;
        PointAttributeVectorOutputIterator<unsigned_int>::operator*(local_20);
        PointAttributeVectorOutputIterator<unsigned_int>::operator=
                  (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
        PointAttributeVectorOutputIterator<unsigned_int>::operator++
                  ((PointAttributeVectorOutputIterator<unsigned_int> *)in_stack_fffffffffffffdc0);
        in_RDI->num_decoded_points_ = in_RDI->num_decoded_points_ + 1;
      }
    }
    else {
      if (in_RDI->num_points_ < in_RDI->num_decoded_points_) {
        local_1 = 0;
        goto LAB_001d62f7;
      }
      local_124 = in_RDI->bit_length_ - local_10c;
      local_128 = 1 << ((char)local_124 - 1U & 0x1f);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator[](&in_RDI->base_stack_,(ulong)(local_ec + 1));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (this_00,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT17(uVar2,in_stack_fffffffffffffe58));
      iVar9 = local_128;
      pvVar8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&in_RDI->base_stack_,(ulong)(local_ec + 1));
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar8,(ulong)local_108);
      *pvVar7 = *pvVar7 + iVar9;
      local_12c = MostSignificantBit(local_e4);
      local_130 = 0;
      DecodeNumber(in_stack_fffffffffffffdc0,nbits,(uint32_t *)0x1d6138);
      local_134 = local_e4 >> 1;
      if (local_134 < local_130) {
        local_1 = 0;
        goto LAB_001d62f7;
      }
      local_134 = local_134 - local_130;
      local_138 = local_e4 - local_134;
      if ((local_134 != local_138) &&
         (bVar3 = DirectBitDecoder::DecodeNextBit(in_stack_fffffffffffffdd8), !bVar3)) {
        std::swap<unsigned_int>(&local_134,&local_138);
      }
      in_stack_fffffffffffffdb8 = (value_type *)&in_RDI->levels_stack_;
      pvVar8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)in_stack_fffffffffffffdb8,(ulong)local_ec);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar8,(ulong)local_108);
      *pvVar7 = *pvVar7 + 1;
      in_stack_fffffffffffffdc0 =
           (DynamicIntegerPointsKdTreeDecoder<5> *)
           std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)in_stack_fffffffffffffdb8,(ulong)local_ec);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)in_stack_fffffffffffffdb8,(ulong)(local_ec + 1));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (this_00,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT17(uVar2,in_stack_fffffffffffffe58));
      if (local_134 != 0) {
        DecodingStatus::DecodingStatus(&local_144,local_134,local_108,local_ec);
        std::
        stack<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>_>
        ::push((stack<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>_>
                *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      }
      if (local_138 != 0) {
        DecodingStatus::DecodingStatus(&local_150,local_138,local_108,local_ec + 1);
        std::
        stack<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>_>
        ::push((stack<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<5>::DecodingStatus>_>_>
                *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      }
    }
  } while( true );
}

Assistant:

bool DynamicIntegerPointsKdTreeDecoder<compression_level_t>::DecodeInternal(
    uint32_t num_points, OutputIteratorT &oit) {
  typedef DecodingStatus Status;
  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  DecodingStatus init_status(num_points, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    const DecodingStatus status = status_stack.top();
    status_stack.pop();

    const uint32_t num_remaining_points = status.num_remaining_points;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    if (num_remaining_points > num_points) {
      return false;
    }

    const uint32_t axis = GetAxis(num_remaining_points, levels, last_axis);
    if (axis >= dimension_) {
      return false;
    }

    const uint32_t level = levels[axis];

    // All axes have been fully subdivided, just output points.
    if ((bit_length_ - level) == 0) {
      for (uint32_t i = 0; i < num_remaining_points; i++) {
        *oit = old_base;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    DRACO_DCHECK_EQ(true, num_remaining_points != 0);

    // Fast decoding of remaining bits if number of points is 1 or 2.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        for (uint32_t j = 0; j < dimension_; j++) {
          p_[axes_[j]] = 0;
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            if (!remaining_bits_decoder_.DecodeLeastSignificantBits32(
                    num_remaining_bits, &p_[axes_[j]])) {
              return false;
            }
          }
          p_[axes_[j]] = old_base[axes_[j]] | p_[axes_[j]];
        }
        *oit = p_;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    if (num_decoded_points_ > num_points_) {
      return false;
    }

    const int num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;         // copy
    base_stack_[stack_pos + 1][axis] += modifier;  // new base

    const int incoming_bits = MostSignificantBit(num_remaining_points);

    uint32_t number = 0;
    DecodeNumber(incoming_bits, &number);

    uint32_t first_half = num_remaining_points / 2;
    if (first_half < number) {
      // Invalid |number|.
      return false;
    }
    first_half -= number;
    uint32_t second_half = num_remaining_points - first_half;

    if (first_half != second_half) {
      if (!half_decoder_.DecodeNextBit()) {
        std::swap(first_half, second_half);
      }
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (first_half) {
      status_stack.push(DecodingStatus(first_half, axis, stack_pos));
    }
    if (second_half) {
      status_stack.push(DecodingStatus(second_half, axis, stack_pos + 1));
    }
  }
  return true;
}